

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedVecs(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int *perm)

{
  undefined8 *puVar1;
  uint *puVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if ((pSVar3->theType == ENTER) &&
     (uVar8 = (int)((long)(pSVar3->weights).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pSVar3->weights).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249,
     0 < (int)uVar8)) {
    lVar9 = 0xc;
    uVar10 = 0;
    do {
      lVar11 = (long)perm[uVar10];
      if (-1 < lVar11) {
        pnVar4 = (pSVar3->weights).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 0x20) =
             *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar9 * 4 + -0x10);
        puVar1 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar9 * 4 + -0x30);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar9 * 4 + -0x20);
        uVar7 = puVar1[1];
        puVar2 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = *puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar7;
        *(undefined8 *)&pnVar4[lVar11].m_backend.data = uVar5;
        *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 8) = uVar6;
        pnVar4[lVar11].m_backend.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar9 * 4 + -8);
        pnVar4[lVar11].m_backend.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar9 * 4 + -4);
        uVar5 = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar9 * 4);
        pnVar4[lVar11].m_backend.fpclass = (int)uVar5;
        pnVar4[lVar11].m_backend.prec_elem = (int)((ulong)uVar5 >> 0x20);
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0xe;
    } while ((uVar8 & 0x7fffffff) != uVar10);
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&pSVar3->weights,
          (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->thevectors->set).thenum,true);
  return;
}

Assistant:

void SPxSteepPR<R>::removedVecs(const int perm[])
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& weights = this->thesolver->weights;

   if(this->thesolver->type() == SPxSolverBase<R>::ENTER)
   {
      int i;
      int j = weights.dim();

      for(i = 0; i < j; ++i)
      {
         if(perm[i] >= 0)
            weights[perm[i]] = weights[i];
      }
   }

   weights.reDim(this->thesolver->coDim());
}